

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::BVHNIntersector1<8,_1,_true,_embree::avx2::SubGridIntersector1Pluecker<8,_true>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ushort uVar6;
  ushort uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  RTCRayQueryContext *pRVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  byte bVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  uint uVar55;
  undefined1 (*pauVar56) [16];
  long lVar57;
  long lVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  undefined1 (*pauVar62) [16];
  ulong uVar63;
  uint uVar64;
  long lVar65;
  undefined1 (*pauVar66) [16];
  long lVar67;
  uint uVar68;
  ulong uVar69;
  undefined1 (*pauVar70) [16];
  uint uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  long lVar76;
  ulong uVar77;
  undefined4 uVar78;
  float fVar79;
  float fVar85;
  float fVar86;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  float fVar87;
  undefined1 auVar84 [32];
  float fVar88;
  float fVar94;
  float fVar95;
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar96;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar97;
  float fVar98;
  undefined1 auVar99 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar108;
  undefined1 auVar103 [32];
  float fVar115;
  undefined8 uVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  __m128 a;
  undefined1 auVar135 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar158;
  undefined1 auVar159 [32];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar160 [64];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  UVIdentity<8> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2a19;
  RayQueryContext *local_2a18;
  ulong local_2a10;
  ulong local_2a08;
  ulong local_2a00;
  ulong local_29f8;
  ulong local_29f0;
  ulong local_29e8;
  uint local_29e0;
  int local_29dc;
  ulong local_29d8;
  ulong local_29d0;
  ulong local_29c8;
  ulong local_29c0;
  ulong local_29b8;
  ulong local_29b0;
  ulong local_29a8;
  long local_29a0;
  long local_2998;
  undefined1 (*local_2990) [16];
  long local_2988;
  Scene *local_2980;
  ulong local_2978;
  RTCFilterFunctionNArguments local_2970;
  undefined1 local_2940 [8];
  float fStack_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  float fStack_2928;
  float fStack_2924;
  undefined1 local_2920 [32];
  float local_28f0;
  float local_28ec;
  float local_28e8;
  undefined4 local_28e4;
  undefined4 local_28e0;
  undefined4 local_28dc;
  undefined4 local_28d8;
  uint local_28d4;
  uint local_28d0;
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2810 [16];
  undefined1 local_2800 [8];
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 *local_2740;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  float local_26a0 [4];
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  undefined4 uStack_2684;
  float local_2680 [4];
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  undefined4 uStack_2664;
  float local_2660 [4];
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  undefined4 uStack_2644;
  float local_2640;
  float fStack_263c;
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  float fStack_2624;
  undefined1 local_2620 [8];
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 == 8) {
    return;
  }
  pauVar56 = (undefined1 (*) [16])local_2390;
  uStack_2398 = 0;
  auVar11 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
  auVar12 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
  aVar1 = (ray->super_RayK<1>).dir.field_0;
  auVar122._8_4_ = 0x7fffffff;
  auVar122._0_8_ = 0x7fffffff7fffffff;
  auVar122._12_4_ = 0x7fffffff;
  auVar122 = vandps_avx((undefined1  [16])aVar1,auVar122);
  auVar135._8_4_ = 0x219392ef;
  auVar135._0_8_ = 0x219392ef219392ef;
  auVar135._12_4_ = 0x219392ef;
  auVar122 = vcmpps_avx(auVar122,auVar135,1);
  auVar133._8_4_ = 0x3f800000;
  auVar133._0_8_ = 0x3f8000003f800000;
  auVar133._12_4_ = 0x3f800000;
  auVar135 = vdivps_avx(auVar133,(undefined1  [16])aVar1);
  auVar134._8_4_ = 0x5d5e0b6b;
  auVar134._0_8_ = 0x5d5e0b6b5d5e0b6b;
  auVar134._12_4_ = 0x5d5e0b6b;
  auVar122 = vblendvps_avx(auVar135,auVar134,auVar122);
  auVar123._0_4_ = auVar122._0_4_ * 0.99999964;
  auVar123._4_4_ = auVar122._4_4_ * 0.99999964;
  auVar123._8_4_ = auVar122._8_4_ * 0.99999964;
  auVar123._12_4_ = auVar122._12_4_ * 0.99999964;
  uVar78 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  local_28a0._4_4_ = uVar78;
  local_28a0._0_4_ = uVar78;
  local_28a0._8_4_ = uVar78;
  local_28a0._12_4_ = uVar78;
  local_28a0._16_4_ = uVar78;
  local_28a0._20_4_ = uVar78;
  local_28a0._24_4_ = uVar78;
  local_28a0._28_4_ = uVar78;
  uVar78 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  local_28c0._4_4_ = uVar78;
  local_28c0._0_4_ = uVar78;
  local_28c0._8_4_ = uVar78;
  local_28c0._12_4_ = uVar78;
  local_28c0._16_4_ = uVar78;
  local_28c0._20_4_ = uVar78;
  local_28c0._24_4_ = uVar78;
  local_28c0._28_4_ = uVar78;
  uVar78 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  local_2560._4_4_ = uVar78;
  local_2560._0_4_ = uVar78;
  local_2560._8_4_ = uVar78;
  local_2560._12_4_ = uVar78;
  local_2560._16_4_ = uVar78;
  local_2560._20_4_ = uVar78;
  local_2560._24_4_ = uVar78;
  local_2560._28_4_ = uVar78;
  auVar160 = ZEXT3264(local_2560);
  auVar117._0_4_ = auVar122._0_4_ * 1.0000004;
  auVar117._4_4_ = auVar122._4_4_ * 1.0000004;
  auVar117._8_4_ = auVar122._8_4_ * 1.0000004;
  auVar117._12_4_ = auVar122._12_4_ * 1.0000004;
  auVar122 = vmovshdup_avx(auVar123);
  uVar116 = auVar122._0_8_;
  register0x000014c8 = uVar116;
  local_27e0 = uVar116;
  register0x000014d0 = uVar116;
  register0x000014d8 = uVar116;
  auVar133 = vshufpd_avx(auVar123,auVar123,1);
  auVar135 = vshufps_avx(auVar123,auVar123,0xaa);
  uVar116 = auVar135._0_8_;
  local_2580._8_8_ = uVar116;
  local_2580._0_8_ = uVar116;
  local_2580._16_8_ = uVar116;
  local_2580._24_8_ = uVar116;
  auVar173 = ZEXT3264(local_2580);
  local_2800._4_4_ = auVar117._0_4_;
  local_2800._0_4_ = auVar117._0_4_;
  fStack_27f8 = auVar117._0_4_;
  fStack_27f4 = auVar117._0_4_;
  fStack_27f0 = auVar117._0_4_;
  fStack_27ec = auVar117._0_4_;
  fStack_27e8 = auVar117._0_4_;
  register0x0000155c = auVar117._0_4_;
  auVar135 = vmovshdup_avx(auVar117);
  uVar116 = auVar135._0_8_;
  local_25a0._8_8_ = uVar116;
  local_25a0._0_8_ = uVar116;
  local_25a0._16_8_ = uVar116;
  local_25a0._24_8_ = uVar116;
  auVar176 = ZEXT3264(local_25a0);
  auVar132 = ZEXT3264(_local_2800);
  auVar135 = vshufps_avx(auVar117,auVar117,0xaa);
  uVar116 = auVar135._0_8_;
  local_25c0._8_8_ = uVar116;
  local_25c0._0_8_ = uVar116;
  local_25c0._16_8_ = uVar116;
  local_25c0._24_8_ = uVar116;
  auVar175 = ZEXT3264(local_25c0);
  uVar60 = (ulong)(auVar123._0_4_ < 0.0) << 5;
  auVar141 = ZEXT3264(local_28a0);
  auVar152 = ZEXT3264(_local_27e0);
  uVar73 = (ulong)(auVar122._0_4_ < 0.0) << 5 | 0x40;
  auVar146 = ZEXT3264(local_28c0);
  uVar63 = (ulong)(auVar133._0_4_ < 0.0) << 5 | 0x80;
  uVar77 = uVar60 ^ 0x20;
  uVar75 = uVar73 ^ 0x20;
  uVar72 = uVar63 ^ 0x20;
  uVar78 = auVar11._0_4_;
  local_25e0._4_4_ = uVar78;
  local_25e0._0_4_ = uVar78;
  local_25e0._8_4_ = uVar78;
  local_25e0._12_4_ = uVar78;
  local_25e0._16_4_ = uVar78;
  local_25e0._20_4_ = uVar78;
  local_25e0._24_4_ = uVar78;
  local_25e0._28_4_ = uVar78;
  auVar171 = ZEXT3264(local_25e0);
  uVar78 = auVar12._0_4_;
  auVar178 = ZEXT3264(CONCAT428(uVar78,CONCAT424(uVar78,CONCAT420(uVar78,CONCAT416(uVar78,CONCAT412(
                                                  uVar78,CONCAT48(uVar78,CONCAT44(uVar78,uVar78)))))
                                                )));
  local_29a8 = (ulong)(((uint)(auVar123._0_4_ < 0.0) << 5) >> 2);
  local_29b0 = uVar77 >> 2;
  local_29b8 = uVar73 >> 2;
  local_29c0 = uVar75 >> 2;
  local_29c8 = uVar63 >> 2;
  local_27c0._16_16_ = mm_lookupmask_ps._240_16_;
  local_27c0._0_16_ = mm_lookupmask_ps._240_16_;
  local_2600 = vperm2f128_avx(local_27c0,mm_lookupmask_ps._0_32_,2);
  local_29d0 = uVar72 >> 2;
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = 0x3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar100._16_4_ = 0x3f800000;
  auVar100._20_4_ = 0x3f800000;
  auVar100._24_4_ = 0x3f800000;
  auVar100._28_4_ = 0x3f800000;
  auVar128._8_4_ = 0xbf800000;
  auVar128._0_8_ = 0xbf800000bf800000;
  auVar128._12_4_ = 0xbf800000;
  auVar128._16_4_ = 0xbf800000;
  auVar128._20_4_ = 0xbf800000;
  auVar128._24_4_ = 0xbf800000;
  auVar128._28_4_ = 0xbf800000;
  _local_2620 = vblendvps_avx(auVar100,auVar128,local_2600);
  local_2640 = auVar123._0_4_;
  fStack_263c = auVar123._0_4_;
  fStack_2638 = auVar123._0_4_;
  fStack_2634 = auVar123._0_4_;
  fStack_2630 = auVar123._0_4_;
  fStack_262c = auVar123._0_4_;
  fStack_2628 = auVar123._0_4_;
  fStack_2624 = auVar123._0_4_;
  local_29f0 = uVar60;
  local_29f8 = uVar73;
  local_2a00 = uVar63;
  local_2a08 = uVar77;
  local_2a10 = uVar75;
  local_2a18 = context;
  fVar111 = auVar123._0_4_;
  fVar109 = auVar123._0_4_;
  fVar107 = auVar123._0_4_;
  fVar105 = auVar123._0_4_;
  fVar98 = auVar123._0_4_;
  fVar114 = auVar123._0_4_;
LAB_019bc7b4:
  do {
    pauVar70 = pauVar56 + -1;
    pauVar56 = pauVar56 + -1;
    if (*(float *)(*pauVar70 + 8) <= (ray->super_RayK<1>).tfar) {
      uVar74 = *(ulong *)*pauVar56;
joined_r0x019bc7cf:
      if ((uVar74 & 8) == 0) {
        auVar128 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + uVar60),auVar141._0_32_);
        auVar28._4_4_ = fVar98 * auVar128._4_4_;
        auVar28._0_4_ = fVar114 * auVar128._0_4_;
        auVar28._8_4_ = fVar105 * auVar128._8_4_;
        auVar28._12_4_ = fVar107 * auVar128._12_4_;
        auVar28._16_4_ = fVar109 * auVar128._16_4_;
        auVar28._20_4_ = fVar111 * auVar128._20_4_;
        auVar28._24_4_ = auVar123._0_4_ * auVar128._24_4_;
        auVar28._28_4_ = auVar128._28_4_;
        auVar128 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + uVar73),auVar146._0_32_);
        auVar29._4_4_ = auVar152._4_4_ * auVar128._4_4_;
        auVar29._0_4_ = auVar152._0_4_ * auVar128._0_4_;
        auVar29._8_4_ = auVar152._8_4_ * auVar128._8_4_;
        auVar29._12_4_ = auVar152._12_4_ * auVar128._12_4_;
        auVar29._16_4_ = auVar152._16_4_ * auVar128._16_4_;
        auVar29._20_4_ = auVar152._20_4_ * auVar128._20_4_;
        auVar29._24_4_ = auVar152._24_4_ * auVar128._24_4_;
        auVar29._28_4_ = auVar128._28_4_;
        auVar128 = vmaxps_avx(auVar28,auVar29);
        auVar100 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + uVar63),auVar160._0_32_);
        auVar30._4_4_ = auVar173._4_4_ * auVar100._4_4_;
        auVar30._0_4_ = auVar173._0_4_ * auVar100._0_4_;
        auVar30._8_4_ = auVar173._8_4_ * auVar100._8_4_;
        auVar30._12_4_ = auVar173._12_4_ * auVar100._12_4_;
        auVar30._16_4_ = auVar173._16_4_ * auVar100._16_4_;
        auVar30._20_4_ = auVar173._20_4_ * auVar100._20_4_;
        auVar30._24_4_ = auVar173._24_4_ * auVar100._24_4_;
        auVar30._28_4_ = auVar100._28_4_;
        auVar100 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + uVar77),auVar141._0_32_);
        auVar31._4_4_ = auVar132._4_4_ * auVar100._4_4_;
        auVar31._0_4_ = auVar132._0_4_ * auVar100._0_4_;
        auVar31._8_4_ = auVar132._8_4_ * auVar100._8_4_;
        auVar31._12_4_ = auVar132._12_4_ * auVar100._12_4_;
        auVar31._16_4_ = auVar132._16_4_ * auVar100._16_4_;
        auVar31._20_4_ = auVar132._20_4_ * auVar100._20_4_;
        auVar31._24_4_ = auVar132._24_4_ * auVar100._24_4_;
        auVar31._28_4_ = auVar100._28_4_;
        auVar100 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + uVar75),auVar146._0_32_);
        auVar32._4_4_ = auVar176._4_4_ * auVar100._4_4_;
        auVar32._0_4_ = auVar176._0_4_ * auVar100._0_4_;
        auVar32._8_4_ = auVar176._8_4_ * auVar100._8_4_;
        auVar32._12_4_ = auVar176._12_4_ * auVar100._12_4_;
        auVar32._16_4_ = auVar176._16_4_ * auVar100._16_4_;
        auVar32._20_4_ = auVar176._20_4_ * auVar100._20_4_;
        auVar32._24_4_ = auVar176._24_4_ * auVar100._24_4_;
        auVar32._28_4_ = auVar100._28_4_;
        auVar13 = vminps_avx(auVar31,auVar32);
        auVar100 = vsubps_avx(*(undefined1 (*) [32])(uVar74 + 0x40 + uVar72),auVar160._0_32_);
        auVar33._4_4_ = auVar175._4_4_ * auVar100._4_4_;
        auVar33._0_4_ = auVar175._0_4_ * auVar100._0_4_;
        auVar33._8_4_ = auVar175._8_4_ * auVar100._8_4_;
        auVar33._12_4_ = auVar175._12_4_ * auVar100._12_4_;
        auVar33._16_4_ = auVar175._16_4_ * auVar100._16_4_;
        auVar33._20_4_ = auVar175._20_4_ * auVar100._20_4_;
        auVar33._24_4_ = auVar175._24_4_ * auVar100._24_4_;
        auVar33._28_4_ = auVar100._28_4_;
        auVar100 = vmaxps_avx(auVar30,auVar171._0_32_);
        local_27a0 = vmaxps_avx(auVar128,auVar100);
        auVar128 = vminps_avx(auVar33,auVar178._0_32_);
        auVar128 = vminps_avx(auVar13,auVar128);
        auVar128 = vcmpps_avx(local_27a0,auVar128,2);
        uVar64 = vmovmskps_avx(auVar128);
        if (uVar64 == 0) {
          if (pauVar56 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_019bc7b4;
        }
        uVar64 = uVar64 & 0xff;
        uVar59 = uVar74 & 0xfffffffffffffff0;
        lVar57 = 0;
        for (uVar74 = (ulong)uVar64; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
          lVar57 = lVar57 + 1;
        }
        uVar74 = *(ulong *)(uVar59 + lVar57 * 8);
        uVar64 = uVar64 - 1 & uVar64;
        uVar61 = (ulong)uVar64;
        if (uVar64 != 0) {
          uVar55 = *(uint *)(local_27a0 + lVar57 * 4);
          lVar57 = 0;
          for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
            lVar57 = lVar57 + 1;
          }
          uVar64 = uVar64 - 1 & uVar64;
          uVar69 = (ulong)uVar64;
          uVar61 = *(ulong *)(uVar59 + lVar57 * 8);
          uVar71 = *(uint *)(local_27a0 + lVar57 * 4);
          if (uVar64 == 0) {
            if (uVar55 < uVar71) {
              *(ulong *)*pauVar56 = uVar61;
              *(uint *)(*pauVar56 + 8) = uVar71;
              pauVar56 = pauVar56 + 1;
            }
            else {
              *(ulong *)*pauVar56 = uVar74;
              *(uint *)(*pauVar56 + 8) = uVar55;
              pauVar56 = pauVar56 + 1;
              uVar74 = uVar61;
            }
          }
          else {
            auVar128 = auVar132._0_32_;
            auVar80._8_8_ = 0;
            auVar80._0_8_ = uVar74;
            auVar122 = vpunpcklqdq_avx(auVar80,ZEXT416(uVar55));
            auVar89._8_8_ = 0;
            auVar89._0_8_ = uVar61;
            auVar135 = vpunpcklqdq_avx(auVar89,ZEXT416(uVar71));
            lVar57 = 0;
            for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
              lVar57 = lVar57 + 1;
            }
            uVar64 = uVar64 - 1 & uVar64;
            uVar74 = (ulong)uVar64;
            auVar99._8_8_ = 0;
            auVar99._0_8_ = *(ulong *)(uVar59 + lVar57 * 8);
            auVar11 = vpunpcklqdq_avx(auVar99,ZEXT416(*(uint *)(local_27a0 + lVar57 * 4)));
            if (uVar64 != 0) {
              lVar57 = 0;
              for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
                lVar57 = lVar57 + 1;
              }
              uVar64 = uVar64 - 1 & uVar64;
              uVar61 = (ulong)uVar64;
              auVar118._8_8_ = 0;
              auVar118._0_8_ = *(ulong *)(uVar59 + lVar57 * 8);
              auVar12 = vpunpcklqdq_avx(auVar118,ZEXT416(*(uint *)(local_27a0 + lVar57 * 4)));
              context = local_2a18;
              uVar63 = local_2a00;
              uVar60 = local_29f0;
              uVar73 = local_29f8;
              uVar75 = local_2a10;
              uVar77 = local_2a08;
              if (uVar64 == 0) {
                auVar133 = vpcmpgtd_avx(auVar135,auVar122);
                auVar117 = vpshufd_avx(auVar133,0xaa);
                auVar133 = vblendvps_avx(auVar135,auVar122,auVar117);
                auVar122 = vblendvps_avx(auVar122,auVar135,auVar117);
                auVar135 = vpcmpgtd_avx(auVar12,auVar11);
                auVar117 = vpshufd_avx(auVar135,0xaa);
                auVar135 = vblendvps_avx(auVar12,auVar11,auVar117);
                auVar11 = vblendvps_avx(auVar11,auVar12,auVar117);
                auVar12 = vpcmpgtd_avx(auVar11,auVar122);
                auVar117 = vpshufd_avx(auVar12,0xaa);
                auVar12 = vblendvps_avx(auVar11,auVar122,auVar117);
                auVar122 = vblendvps_avx(auVar122,auVar11,auVar117);
                auVar11 = vpcmpgtd_avx(auVar135,auVar133);
                auVar117 = vpshufd_avx(auVar11,0xaa);
                auVar11 = vblendvps_avx(auVar135,auVar133,auVar117);
                auVar135 = vblendvps_avx(auVar133,auVar135,auVar117);
                auVar133 = vpcmpgtd_avx(auVar12,auVar135);
                auVar117 = vpshufd_avx(auVar133,0xaa);
                auVar133 = vblendvps_avx(auVar12,auVar135,auVar117);
                auVar135 = vblendvps_avx(auVar135,auVar12,auVar117);
                *pauVar56 = auVar122;
                pauVar56[1] = auVar135;
                pauVar56[2] = auVar133;
                uVar74 = auVar11._0_8_;
                pauVar70 = pauVar56 + 3;
              }
              else {
                *pauVar56 = auVar122;
                pauVar56[1] = auVar135;
                pauVar56[2] = auVar11;
                pauVar56[3] = auVar12;
                lVar57 = 0x30;
                do {
                  lVar65 = lVar57;
                  lVar57 = 0;
                  for (uVar74 = uVar61; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000
                      ) {
                    lVar57 = lVar57 + 1;
                  }
                  uVar74 = *(ulong *)(uVar59 + lVar57 * 8);
                  auVar81._8_8_ = 0;
                  auVar81._0_8_ = uVar74;
                  auVar122 = vpunpcklqdq_avx(auVar81,ZEXT416(*(uint *)(local_27a0 + lVar57 * 4)));
                  *(undefined1 (*) [16])(pauVar56[1] + lVar65) = auVar122;
                  uVar61 = uVar61 - 1 & uVar61;
                  lVar57 = lVar65 + 0x10;
                } while (uVar61 != 0);
                pauVar70 = (undefined1 (*) [16])(pauVar56[1] + lVar65);
                if (lVar65 + 0x10 == 0) {
                  auVar141 = ZEXT3264(local_28a0);
                  auVar146 = ZEXT3264(local_28c0);
                  auVar132 = ZEXT3264(auVar128);
                  pauVar56 = pauVar70;
                  goto joined_r0x019bc7cf;
                }
                lVar57 = 0x10;
                pauVar62 = pauVar56;
                do {
                  auVar122 = pauVar62[1];
                  pauVar62 = pauVar62 + 1;
                  uVar64 = vextractps_avx(auVar122,2);
                  lVar65 = lVar57;
                  do {
                    if (uVar64 <= *(uint *)(pauVar56[-1] + lVar65 + 8)) {
                      pauVar66 = (undefined1 (*) [16])(*pauVar56 + lVar65);
                      break;
                    }
                    *(undefined1 (*) [16])(*pauVar56 + lVar65) =
                         *(undefined1 (*) [16])(pauVar56[-1] + lVar65);
                    lVar65 = lVar65 + -0x10;
                    pauVar66 = pauVar56;
                  } while (lVar65 != 0);
                  *pauVar66 = auVar122;
                  lVar57 = lVar57 + 0x10;
                } while (pauVar70 != pauVar62);
                uVar74 = *(ulong *)*pauVar70;
              }
              auVar141 = ZEXT3264(local_28a0);
              auVar146 = ZEXT3264(local_28c0);
              auVar132 = ZEXT3264(auVar128);
              pauVar56 = pauVar70;
              goto joined_r0x019bc7cf;
            }
            auVar12 = vpcmpgtd_avx(auVar135,auVar122);
            auVar133 = vpshufd_avx(auVar12,0xaa);
            auVar12 = vblendvps_avx(auVar135,auVar122,auVar133);
            auVar122 = vblendvps_avx(auVar122,auVar135,auVar133);
            auVar135 = vpcmpgtd_avx(auVar11,auVar12);
            auVar133 = vpshufd_avx(auVar135,0xaa);
            auVar135 = vblendvps_avx(auVar11,auVar12,auVar133);
            auVar11 = vblendvps_avx(auVar12,auVar11,auVar133);
            auVar12 = vpcmpgtd_avx(auVar11,auVar122);
            auVar133 = vpshufd_avx(auVar12,0xaa);
            auVar12 = vblendvps_avx(auVar11,auVar122,auVar133);
            auVar122 = vblendvps_avx(auVar122,auVar11,auVar133);
            *pauVar56 = auVar122;
            pauVar56[1] = auVar12;
            uVar74 = auVar135._0_8_;
            auVar132 = ZEXT3264(auVar128);
            pauVar56 = pauVar56 + 2;
          }
        }
        goto joined_r0x019bc7cf;
      }
      local_29a0 = (ulong)((uint)uVar74 & 0xf) - 8;
      if (local_29a0 != 0) {
        uVar74 = uVar74 & 0xfffffffffffffff0;
        local_2998 = 0;
        local_2540 = auVar178._0_32_;
        local_2990 = pauVar56;
        do {
          lVar57 = local_2998 * 0x90;
          uVar78 = *(undefined4 *)(uVar74 + 0x70 + lVar57);
          auVar101._4_4_ = uVar78;
          auVar101._0_4_ = uVar78;
          auVar101._8_4_ = uVar78;
          auVar101._12_4_ = uVar78;
          auVar101._16_4_ = uVar78;
          auVar101._20_4_ = uVar78;
          auVar101._24_4_ = uVar78;
          auVar101._28_4_ = uVar78;
          uVar78 = *(undefined4 *)(uVar74 + 0x7c + lVar57);
          auVar119._4_4_ = uVar78;
          auVar119._0_4_ = uVar78;
          auVar119._8_4_ = uVar78;
          auVar119._12_4_ = uVar78;
          auVar119._16_4_ = uVar78;
          auVar119._20_4_ = uVar78;
          auVar119._24_4_ = uVar78;
          auVar119._28_4_ = uVar78;
          local_2988 = uVar74 + lVar57;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *(ulong *)(local_29a8 + 0x40 + local_2988);
          auVar128 = vpmovzxbd_avx2(auVar11);
          auVar128 = vcvtdq2ps_avx(auVar128);
          auVar11 = vfmadd213ps_fma(auVar128,auVar119,auVar101);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *(ulong *)(local_29b0 + 0x40 + local_2988);
          auVar128 = vpmovzxbd_avx2(auVar12);
          auVar128 = vcvtdq2ps_avx(auVar128);
          uVar78 = *(undefined4 *)(uVar74 + 0x74 + lVar57);
          auVar124._4_4_ = uVar78;
          auVar124._0_4_ = uVar78;
          auVar124._8_4_ = uVar78;
          auVar124._12_4_ = uVar78;
          auVar124._16_4_ = uVar78;
          auVar124._20_4_ = uVar78;
          auVar124._24_4_ = uVar78;
          auVar124._28_4_ = uVar78;
          uVar78 = *(undefined4 *)(uVar74 + 0x80 + lVar57);
          auVar136._4_4_ = uVar78;
          auVar136._0_4_ = uVar78;
          auVar136._8_4_ = uVar78;
          auVar136._12_4_ = uVar78;
          auVar136._16_4_ = uVar78;
          auVar136._20_4_ = uVar78;
          auVar136._24_4_ = uVar78;
          auVar136._28_4_ = uVar78;
          auVar12 = vfmadd213ps_fma(auVar128,auVar119,auVar101);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(local_29b8 + 0x40 + local_2988);
          auVar128 = vpmovzxbd_avx2(auVar2);
          auVar128 = vcvtdq2ps_avx(auVar128);
          auVar133 = vfmadd213ps_fma(auVar128,auVar136,auVar124);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(local_29c0 + 0x40 + local_2988);
          auVar128 = vpmovzxbd_avx2(auVar3);
          auVar128 = vcvtdq2ps_avx(auVar128);
          uVar78 = *(undefined4 *)(uVar74 + 0x78 + lVar57);
          auVar143._4_4_ = uVar78;
          auVar143._0_4_ = uVar78;
          auVar143._8_4_ = uVar78;
          auVar143._12_4_ = uVar78;
          auVar143._16_4_ = uVar78;
          auVar143._20_4_ = uVar78;
          auVar143._24_4_ = uVar78;
          auVar143._28_4_ = uVar78;
          uVar78 = *(undefined4 *)(uVar74 + 0x84 + lVar57);
          auVar148._4_4_ = uVar78;
          auVar148._0_4_ = uVar78;
          auVar148._8_4_ = uVar78;
          auVar148._12_4_ = uVar78;
          auVar148._16_4_ = uVar78;
          auVar148._20_4_ = uVar78;
          auVar148._24_4_ = uVar78;
          auVar148._28_4_ = uVar78;
          auVar117 = vfmadd213ps_fma(auVar128,auVar136,auVar124);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(local_29c8 + 0x40 + local_2988);
          auVar128 = vpmovzxbd_avx2(auVar4);
          auVar128 = vcvtdq2ps_avx(auVar128);
          auVar134 = vfmadd213ps_fma(auVar128,auVar148,auVar143);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(local_29d0 + 0x40 + local_2988);
          auVar128 = vpmovzxbd_avx2(auVar5);
          auVar128 = vcvtdq2ps_avx(auVar128);
          auVar2 = vfmadd213ps_fma(auVar128,auVar148,auVar143);
          auVar142._8_8_ = 0;
          auVar142._0_8_ = *(ulong *)(uVar74 + 0x40 + lVar57);
          auVar147._8_8_ = 0;
          auVar147._0_8_ = *(ulong *)(uVar74 + 0x48 + lVar57);
          auVar122 = vpminub_avx(auVar142,auVar147);
          auVar135 = vpcmpeqb_avx(auVar142,auVar122);
          auVar128 = vsubps_avx(ZEXT1632(auVar11),local_28a0);
          auVar13._4_4_ = fVar98 * auVar128._4_4_;
          auVar13._0_4_ = fVar114 * auVar128._0_4_;
          auVar13._8_4_ = fVar105 * auVar128._8_4_;
          auVar13._12_4_ = fVar107 * auVar128._12_4_;
          auVar13._16_4_ = fVar109 * auVar128._16_4_;
          auVar13._20_4_ = fVar111 * auVar128._20_4_;
          auVar13._24_4_ = auVar123._0_4_ * auVar128._24_4_;
          auVar13._28_4_ = auVar128._28_4_;
          auVar128 = vsubps_avx(ZEXT1632(auVar133),local_28c0);
          auVar24._4_4_ = auVar128._4_4_ * (float)local_27e0._4_4_;
          auVar24._0_4_ = auVar128._0_4_ * (float)local_27e0._0_4_;
          auVar24._8_4_ = auVar128._8_4_ * fStack_27d8;
          auVar24._12_4_ = auVar128._12_4_ * fStack_27d4;
          auVar24._16_4_ = auVar128._16_4_ * fStack_27d0;
          auVar24._20_4_ = auVar128._20_4_ * fStack_27cc;
          auVar24._24_4_ = auVar128._24_4_ * fStack_27c8;
          auVar24._28_4_ = auVar128._28_4_;
          auVar128 = vmaxps_avx(auVar13,auVar24);
          auVar100 = vsubps_avx(ZEXT1632(auVar12),local_28a0);
          auVar121._4_4_ = auVar100._4_4_ * (float)local_2800._4_4_;
          auVar121._0_4_ = auVar100._0_4_ * (float)local_2800._0_4_;
          auVar121._8_4_ = auVar100._8_4_ * fStack_27f8;
          auVar121._12_4_ = auVar100._12_4_ * fStack_27f4;
          auVar121._16_4_ = auVar100._16_4_ * fStack_27f0;
          auVar121._20_4_ = auVar100._20_4_ * fStack_27ec;
          auVar121._24_4_ = auVar100._24_4_ * fStack_27e8;
          auVar121._28_4_ = auVar100._28_4_;
          auVar100 = vsubps_avx(ZEXT1632(auVar117),local_28c0);
          auVar26._4_4_ = auVar176._4_4_ * auVar100._4_4_;
          auVar26._0_4_ = auVar176._0_4_ * auVar100._0_4_;
          auVar26._8_4_ = auVar176._8_4_ * auVar100._8_4_;
          auVar26._12_4_ = auVar176._12_4_ * auVar100._12_4_;
          auVar26._16_4_ = auVar176._16_4_ * auVar100._16_4_;
          auVar26._20_4_ = auVar176._20_4_ * auVar100._20_4_;
          auVar26._24_4_ = auVar176._24_4_ * auVar100._24_4_;
          auVar26._28_4_ = auVar100._28_4_;
          auVar13 = vminps_avx(auVar121,auVar26);
          auVar100 = vsubps_avx(ZEXT1632(auVar134),auVar160._0_32_);
          auVar129._4_4_ = auVar173._4_4_ * auVar100._4_4_;
          auVar129._0_4_ = auVar173._0_4_ * auVar100._0_4_;
          auVar129._8_4_ = auVar173._8_4_ * auVar100._8_4_;
          auVar129._12_4_ = auVar173._12_4_ * auVar100._12_4_;
          auVar129._16_4_ = auVar173._16_4_ * auVar100._16_4_;
          auVar129._20_4_ = auVar173._20_4_ * auVar100._20_4_;
          auVar129._24_4_ = auVar173._24_4_ * auVar100._24_4_;
          auVar129._28_4_ = auVar100._28_4_;
          auVar100 = vmaxps_avx(auVar129,auVar171._0_32_);
          local_23c0 = vmaxps_avx(auVar128,auVar100);
          auVar128 = vsubps_avx(ZEXT1632(auVar2),auVar160._0_32_);
          auVar25._4_4_ = auVar175._4_4_ * auVar128._4_4_;
          auVar25._0_4_ = auVar175._0_4_ * auVar128._0_4_;
          auVar25._8_4_ = auVar175._8_4_ * auVar128._8_4_;
          auVar25._12_4_ = auVar175._12_4_ * auVar128._12_4_;
          auVar25._16_4_ = auVar175._16_4_ * auVar128._16_4_;
          auVar25._20_4_ = auVar175._20_4_ * auVar128._20_4_;
          auVar25._24_4_ = auVar175._24_4_ * auVar128._24_4_;
          auVar25._28_4_ = auVar128._28_4_;
          auVar128 = vminps_avx(auVar25,auVar178._0_32_);
          auVar128 = vminps_avx(auVar13,auVar128);
          auVar128 = vcmpps_avx(local_23c0,auVar128,2);
          auVar122 = vpackssdw_avx(auVar128._0_16_,auVar128._16_16_);
          auVar135 = vpmovzxbw_avx(auVar135);
          auVar122 = vpand_avx(auVar122,auVar135);
          auVar122 = vpshufb_avx(auVar122,_DAT_01fed3c0);
          bVar27 = SUB161(auVar122 >> 7,0) & 1 | (SUB161(auVar122 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar122 >> 0x17,0) & 1) << 2 | (SUB161(auVar122 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar122 >> 0x27,0) & 1) << 4 | (SUB161(auVar122 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar122 >> 0x37,0) & 1) << 6 | SUB161(auVar122 >> 0x3f,0) << 7;
          if (bVar27 != 0) {
            local_2978 = (ulong)bVar27;
            do {
              lVar57 = 0;
              for (uVar59 = local_2978; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000
                  ) {
                lVar57 = lVar57 + 1;
              }
              fVar114 = (ray->super_RayK<1>).tfar;
              if (*(float *)(local_23c0 + lVar57 * 4) <= fVar114) {
                local_2810 = ZEXT416((uint)fVar114);
                uVar6 = *(ushort *)(local_2988 + lVar57 * 8);
                uVar7 = *(ushort *)(local_2988 + 2 + lVar57 * 8);
                uVar64 = *(uint *)(local_2988 + 0x88);
                local_29e8 = (ulong)uVar64;
                uVar55 = *(uint *)(local_2988 + 4 + lVar57 * 8);
                local_2980 = context->scene;
                pGVar8 = (local_2980->geometries).items[local_29e8].ptr;
                lVar57 = *(long *)&pGVar8->field_0x58;
                local_29d8 = (ulong)uVar55;
                lVar67 = pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                         * (ulong)uVar55;
                uVar68 = uVar6 & 0x7fff;
                local_29e0 = uVar7 & 0x7fff;
                uVar71 = *(uint *)(lVar57 + 4 + lVar67);
                uVar60 = (ulong)uVar71;
                uVar73 = (ulong)(uVar71 * local_29e0 + *(int *)(lVar57 + lVar67) + uVar68);
                lVar65 = *(long *)&pGVar8[1].time_range.upper;
                p_Var9 = pGVar8[1].intersectionFilterN;
                auVar122 = *(undefined1 (*) [16])(lVar65 + (uVar73 + 1) * (long)p_Var9);
                auVar135 = *(undefined1 (*) [16])(lVar65 + (uVar73 + uVar60) * (long)p_Var9);
                lVar76 = uVar73 + uVar60 + 1;
                auVar11 = *(undefined1 (*) [16])(lVar65 + lVar76 * (long)p_Var9);
                auVar12 = *(undefined1 (*) [16])
                           (lVar65 + (uVar73 + (-1 < (short)uVar6) + 1) * (long)p_Var9);
                lVar58 = (ulong)(-1 < (short)uVar6) + lVar76;
                uVar63 = 0;
                if (-1 < (short)uVar7) {
                  uVar63 = uVar60;
                }
                auVar133 = *(undefined1 (*) [16])(lVar65 + lVar58 * (long)p_Var9);
                auVar117 = *(undefined1 (*) [16])
                            (lVar65 + (uVar73 + uVar60 + uVar63) * (long)p_Var9);
                auVar123 = *(undefined1 (*) [16])(lVar65 + (lVar76 + uVar63) * (long)p_Var9);
                auVar153._16_16_ = *(undefined1 (*) [16])(lVar65 + (uVar63 + lVar58) * (long)p_Var9)
                ;
                auVar153._0_16_ = auVar11;
                auVar2 = vunpcklps_avx(auVar122,auVar133);
                auVar134 = vunpckhps_avx(auVar122,auVar133);
                auVar3 = vunpcklps_avx(auVar12,auVar11);
                auVar12 = vunpckhps_avx(auVar12,auVar11);
                auVar4 = vunpcklps_avx(auVar134,auVar12);
                auVar5 = vunpcklps_avx(auVar2,auVar3);
                auVar12 = vunpckhps_avx(auVar2,auVar3);
                auVar2 = vunpcklps_avx(auVar135,auVar123);
                auVar134 = vunpckhps_avx(auVar135,auVar123);
                auVar3 = vunpcklps_avx(auVar11,auVar117);
                auVar117 = vunpckhps_avx(auVar11,auVar117);
                auVar134 = vunpcklps_avx(auVar134,auVar117);
                auVar142 = vunpcklps_avx(auVar2,auVar3);
                auVar117 = vunpckhps_avx(auVar2,auVar3);
                auVar102._16_16_ = auVar123;
                auVar102._0_16_ = auVar135;
                auVar82._16_16_ = auVar133;
                auVar82._0_16_ = auVar122;
                auVar128 = vunpcklps_avx(auVar82,auVar102);
                auVar90._16_16_ = auVar11;
                auVar90._0_16_ = *(undefined1 (*) [16])(lVar65 + (long)p_Var9 * uVar73);
                auVar100 = vunpcklps_avx(auVar90,auVar153);
                auVar26 = vunpcklps_avx(auVar100,auVar128);
                auVar128 = vunpckhps_avx(auVar100,auVar128);
                auVar100 = vunpckhps_avx(auVar82,auVar102);
                auVar13 = vunpckhps_avx(auVar90,auVar153);
                auVar100 = vunpcklps_avx(auVar13,auVar100);
                auVar174._16_16_ = auVar5;
                auVar174._0_16_ = auVar5;
                auVar125._16_16_ = auVar12;
                auVar125._0_16_ = auVar12;
                auVar137._16_16_ = auVar4;
                auVar137._0_16_ = auVar4;
                auVar154._16_16_ = auVar142;
                auVar154._0_16_ = auVar142;
                auVar159._16_16_ = auVar117;
                auVar159._0_16_ = auVar117;
                uVar78 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
                auVar167._4_4_ = uVar78;
                auVar167._0_4_ = uVar78;
                auVar167._8_4_ = uVar78;
                auVar167._12_4_ = uVar78;
                auVar167._16_4_ = uVar78;
                auVar167._20_4_ = uVar78;
                auVar167._24_4_ = uVar78;
                auVar167._28_4_ = uVar78;
                uVar78 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
                auVar170._4_4_ = uVar78;
                auVar170._0_4_ = uVar78;
                auVar170._8_4_ = uVar78;
                auVar170._12_4_ = uVar78;
                auVar170._16_4_ = uVar78;
                auVar170._20_4_ = uVar78;
                auVar170._24_4_ = uVar78;
                auVar170._28_4_ = uVar78;
                auVar144._16_16_ = auVar134;
                auVar144._0_16_ = auVar134;
                uVar78 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                auVar172._4_4_ = uVar78;
                auVar172._0_4_ = uVar78;
                auVar172._8_4_ = uVar78;
                auVar172._12_4_ = uVar78;
                auVar172._16_4_ = uVar78;
                auVar172._20_4_ = uVar78;
                auVar172._24_4_ = uVar78;
                auVar172._28_4_ = uVar78;
                local_23e0 = vsubps_avx(auVar26,auVar167);
                local_2400 = vsubps_avx(auVar128,auVar170);
                local_2420 = vsubps_avx(auVar100,auVar172);
                auVar128 = vsubps_avx(auVar174,auVar167);
                local_2860 = vsubps_avx(auVar125,auVar170);
                auVar100 = vsubps_avx(auVar137,auVar172);
                auVar13 = vsubps_avx(auVar154,auVar167);
                auVar24 = vsubps_avx(auVar159,auVar170);
                auVar121 = vsubps_avx(auVar144,auVar172);
                local_2440 = vsubps_avx(auVar13,local_23e0);
                local_2480 = vsubps_avx(auVar24,local_2400);
                local_2460 = vsubps_avx(auVar121,local_2420);
                auVar83._0_4_ = auVar13._0_4_ + local_23e0._0_4_;
                auVar83._4_4_ = auVar13._4_4_ + local_23e0._4_4_;
                auVar83._8_4_ = auVar13._8_4_ + local_23e0._8_4_;
                auVar83._12_4_ = auVar13._12_4_ + local_23e0._12_4_;
                auVar83._16_4_ = auVar13._16_4_ + local_23e0._16_4_;
                auVar83._20_4_ = auVar13._20_4_ + local_23e0._20_4_;
                auVar83._24_4_ = auVar13._24_4_ + local_23e0._24_4_;
                auVar83._28_4_ = auVar13._28_4_ + local_23e0._28_4_;
                auVar120._0_4_ = auVar24._0_4_ + local_2400._0_4_;
                auVar120._4_4_ = auVar24._4_4_ + local_2400._4_4_;
                auVar120._8_4_ = auVar24._8_4_ + local_2400._8_4_;
                auVar120._12_4_ = auVar24._12_4_ + local_2400._12_4_;
                auVar120._16_4_ = auVar24._16_4_ + local_2400._16_4_;
                auVar120._20_4_ = auVar24._20_4_ + local_2400._20_4_;
                auVar120._24_4_ = auVar24._24_4_ + local_2400._24_4_;
                auVar120._28_4_ = auVar24._28_4_ + local_2400._28_4_;
                fVar98 = local_2420._0_4_;
                auVar145._0_4_ = auVar121._0_4_ + fVar98;
                fVar105 = local_2420._4_4_;
                auVar145._4_4_ = auVar121._4_4_ + fVar105;
                fVar107 = local_2420._8_4_;
                auVar145._8_4_ = auVar121._8_4_ + fVar107;
                fVar109 = local_2420._12_4_;
                auVar145._12_4_ = auVar121._12_4_ + fVar109;
                fVar111 = local_2420._16_4_;
                auVar145._16_4_ = auVar121._16_4_ + fVar111;
                auVar123._0_4_ = local_2420._20_4_;
                auVar145._20_4_ = auVar121._20_4_ + auVar123._0_4_;
                fVar115 = local_2420._24_4_;
                auVar145._24_4_ = auVar121._24_4_ + fVar115;
                auVar145._28_4_ = auVar121._28_4_ + local_2420._28_4_;
                auVar34._4_4_ = local_2460._4_4_ * auVar120._4_4_;
                auVar34._0_4_ = local_2460._0_4_ * auVar120._0_4_;
                auVar34._8_4_ = local_2460._8_4_ * auVar120._8_4_;
                auVar34._12_4_ = local_2460._12_4_ * auVar120._12_4_;
                auVar34._16_4_ = local_2460._16_4_ * auVar120._16_4_;
                auVar34._20_4_ = local_2460._20_4_ * auVar120._20_4_;
                auVar34._24_4_ = local_2460._24_4_ * auVar120._24_4_;
                auVar34._28_4_ = auVar26._28_4_;
                auVar135 = vfmsub231ps_fma(auVar34,local_2480,auVar145);
                auVar35._4_4_ = local_2440._4_4_ * auVar145._4_4_;
                auVar35._0_4_ = local_2440._0_4_ * auVar145._0_4_;
                auVar35._8_4_ = local_2440._8_4_ * auVar145._8_4_;
                auVar35._12_4_ = local_2440._12_4_ * auVar145._12_4_;
                auVar35._16_4_ = local_2440._16_4_ * auVar145._16_4_;
                auVar35._20_4_ = local_2440._20_4_ * auVar145._20_4_;
                auVar35._24_4_ = local_2440._24_4_ * auVar145._24_4_;
                auVar35._28_4_ = auVar145._28_4_;
                auVar122 = vfmsub231ps_fma(auVar35,local_2460,auVar83);
                auVar36._4_4_ = local_2480._4_4_ * auVar83._4_4_;
                auVar36._0_4_ = local_2480._0_4_ * auVar83._0_4_;
                auVar36._8_4_ = local_2480._8_4_ * auVar83._8_4_;
                auVar36._12_4_ = local_2480._12_4_ * auVar83._12_4_;
                auVar36._16_4_ = local_2480._16_4_ * auVar83._16_4_;
                auVar36._20_4_ = local_2480._20_4_ * auVar83._20_4_;
                auVar36._24_4_ = local_2480._24_4_ * auVar83._24_4_;
                auVar36._28_4_ = auVar83._28_4_;
                auVar11 = vfmsub231ps_fma(auVar36,local_2440,auVar120);
                uVar78 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
                local_2880._4_4_ = uVar78;
                local_2880._0_4_ = uVar78;
                local_2880._8_4_ = uVar78;
                local_2880._12_4_ = uVar78;
                local_2880._16_4_ = uVar78;
                local_2880._20_4_ = uVar78;
                local_2880._24_4_ = uVar78;
                local_2880._28_4_ = uVar78;
                local_2940._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
                auVar37._4_4_ = (float)local_2940._4_4_ * auVar11._4_4_;
                auVar37._0_4_ = (float)local_2940._4_4_ * auVar11._0_4_;
                auVar37._8_4_ = (float)local_2940._4_4_ * auVar11._8_4_;
                auVar37._12_4_ = (float)local_2940._4_4_ * auVar11._12_4_;
                auVar37._16_4_ = (float)local_2940._4_4_ * 0.0;
                auVar37._20_4_ = (float)local_2940._4_4_ * 0.0;
                auVar37._24_4_ = (float)local_2940._4_4_ * 0.0;
                auVar37._28_4_ = auVar120._28_4_;
                auVar122 = vfmadd231ps_fma(auVar37,local_2880,ZEXT1632(auVar122));
                uVar78 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
                local_2920._4_4_ = uVar78;
                local_2920._0_4_ = uVar78;
                local_2920._8_4_ = uVar78;
                local_2920._12_4_ = uVar78;
                local_2920._16_4_ = uVar78;
                local_2920._20_4_ = uVar78;
                local_2920._24_4_ = uVar78;
                local_2920._28_4_ = uVar78;
                auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),local_2920,ZEXT1632(auVar135));
                local_24a0 = vsubps_avx(local_2400,local_2860);
                local_24c0 = vsubps_avx(local_2420,auVar100);
                auVar177._0_4_ = local_2400._0_4_ + local_2860._0_4_;
                auVar177._4_4_ = local_2400._4_4_ + local_2860._4_4_;
                auVar177._8_4_ = local_2400._8_4_ + local_2860._8_4_;
                auVar177._12_4_ = local_2400._12_4_ + local_2860._12_4_;
                auVar177._16_4_ = local_2400._16_4_ + local_2860._16_4_;
                auVar177._20_4_ = local_2400._20_4_ + local_2860._20_4_;
                auVar177._24_4_ = local_2400._24_4_ + local_2860._24_4_;
                auVar177._28_4_ = local_2400._28_4_ + local_2860._28_4_;
                auVar149._0_4_ = auVar100._0_4_ + fVar98;
                auVar149._4_4_ = auVar100._4_4_ + fVar105;
                auVar149._8_4_ = auVar100._8_4_ + fVar107;
                auVar149._12_4_ = auVar100._12_4_ + fVar109;
                auVar149._16_4_ = auVar100._16_4_ + fVar111;
                auVar149._20_4_ = auVar100._20_4_ + auVar123._0_4_;
                auVar149._24_4_ = auVar100._24_4_ + fVar115;
                fVar88 = auVar100._28_4_;
                auVar149._28_4_ = fVar88 + local_2420._28_4_;
                fVar79 = local_24c0._0_4_;
                fVar87 = local_24c0._4_4_;
                auVar38._4_4_ = auVar177._4_4_ * fVar87;
                auVar38._0_4_ = auVar177._0_4_ * fVar79;
                fVar106 = local_24c0._8_4_;
                auVar38._8_4_ = auVar177._8_4_ * fVar106;
                fVar112 = local_24c0._12_4_;
                auVar38._12_4_ = auVar177._12_4_ * fVar112;
                fVar15 = local_24c0._16_4_;
                auVar38._16_4_ = auVar177._16_4_ * fVar15;
                fVar18 = local_24c0._20_4_;
                auVar38._20_4_ = auVar177._20_4_ * fVar18;
                fVar21 = local_24c0._24_4_;
                auVar38._24_4_ = auVar177._24_4_ * fVar21;
                auVar38._28_4_ = local_2440._28_4_;
                auVar11 = vfmsub231ps_fma(auVar38,local_24a0,auVar149);
                auVar26 = vsubps_avx(local_23e0,auVar128);
                fVar85 = auVar26._0_4_;
                fVar97 = auVar26._4_4_;
                auVar39._4_4_ = auVar149._4_4_ * fVar97;
                auVar39._0_4_ = auVar149._0_4_ * fVar85;
                fVar108 = auVar26._8_4_;
                auVar39._8_4_ = auVar149._8_4_ * fVar108;
                fVar113 = auVar26._12_4_;
                auVar39._12_4_ = auVar149._12_4_ * fVar113;
                fVar16 = auVar26._16_4_;
                auVar39._16_4_ = auVar149._16_4_ * fVar16;
                fVar19 = auVar26._20_4_;
                auVar39._20_4_ = auVar149._20_4_ * fVar19;
                fVar22 = auVar26._24_4_;
                auVar39._24_4_ = auVar149._24_4_ * fVar22;
                auVar39._28_4_ = local_2460._28_4_;
                auVar150._0_4_ = auVar128._0_4_ + local_23e0._0_4_;
                auVar150._4_4_ = auVar128._4_4_ + local_23e0._4_4_;
                auVar150._8_4_ = auVar128._8_4_ + local_23e0._8_4_;
                auVar150._12_4_ = auVar128._12_4_ + local_23e0._12_4_;
                auVar150._16_4_ = auVar128._16_4_ + local_23e0._16_4_;
                auVar150._20_4_ = auVar128._20_4_ + local_23e0._20_4_;
                auVar150._24_4_ = auVar128._24_4_ + local_23e0._24_4_;
                auVar150._28_4_ = auVar128._28_4_ + local_23e0._28_4_;
                auVar135 = vfmsub231ps_fma(auVar39,local_24c0,auVar150);
                fVar86 = local_24a0._0_4_;
                fVar104 = local_24a0._4_4_;
                auVar40._4_4_ = auVar150._4_4_ * fVar104;
                auVar40._0_4_ = auVar150._0_4_ * fVar86;
                fVar110 = local_24a0._8_4_;
                auVar40._8_4_ = auVar150._8_4_ * fVar110;
                fVar14 = local_24a0._12_4_;
                auVar40._12_4_ = auVar150._12_4_ * fVar14;
                fVar17 = local_24a0._16_4_;
                auVar40._16_4_ = auVar150._16_4_ * fVar17;
                fVar20 = local_24a0._20_4_;
                auVar40._20_4_ = auVar150._20_4_ * fVar20;
                fVar23 = local_24a0._24_4_;
                auVar40._24_4_ = auVar150._24_4_ * fVar23;
                auVar40._28_4_ = auVar150._28_4_;
                auVar12 = vfmsub231ps_fma(auVar40,auVar26,auVar177);
                auVar151._0_4_ = (float)local_2940._4_4_ * auVar12._0_4_;
                auVar151._4_4_ = (float)local_2940._4_4_ * auVar12._4_4_;
                auVar151._8_4_ = (float)local_2940._4_4_ * auVar12._8_4_;
                auVar151._12_4_ = (float)local_2940._4_4_ * auVar12._12_4_;
                auVar151._16_4_ = (float)local_2940._4_4_ * 0.0;
                auVar151._20_4_ = (float)local_2940._4_4_ * 0.0;
                auVar151._24_4_ = (float)local_2940._4_4_ * 0.0;
                auVar151._28_4_ = 0;
                auVar135 = vfmadd231ps_fma(auVar151,local_2880,ZEXT1632(auVar135));
                auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),local_2920,ZEXT1632(auVar11));
                auVar129 = vsubps_avx(auVar128,auVar13);
                auVar138._0_4_ = auVar128._0_4_ + auVar13._0_4_;
                auVar138._4_4_ = auVar128._4_4_ + auVar13._4_4_;
                auVar138._8_4_ = auVar128._8_4_ + auVar13._8_4_;
                auVar138._12_4_ = auVar128._12_4_ + auVar13._12_4_;
                auVar138._16_4_ = auVar128._16_4_ + auVar13._16_4_;
                auVar138._20_4_ = auVar128._20_4_ + auVar13._20_4_;
                auVar138._24_4_ = auVar128._24_4_ + auVar13._24_4_;
                auVar138._28_4_ = auVar128._28_4_ + auVar13._28_4_;
                auVar25 = vsubps_avx(local_2860,auVar24);
                auVar126._0_4_ = auVar24._0_4_ + local_2860._0_4_;
                auVar126._4_4_ = auVar24._4_4_ + local_2860._4_4_;
                auVar126._8_4_ = auVar24._8_4_ + local_2860._8_4_;
                auVar126._12_4_ = auVar24._12_4_ + local_2860._12_4_;
                auVar126._16_4_ = auVar24._16_4_ + local_2860._16_4_;
                auVar126._20_4_ = auVar24._20_4_ + local_2860._20_4_;
                auVar126._24_4_ = auVar24._24_4_ + local_2860._24_4_;
                auVar126._28_4_ = auVar24._28_4_ + local_2860._28_4_;
                auVar24 = vsubps_avx(auVar100,auVar121);
                auVar91._0_4_ = auVar100._0_4_ + auVar121._0_4_;
                auVar91._4_4_ = auVar100._4_4_ + auVar121._4_4_;
                auVar91._8_4_ = auVar100._8_4_ + auVar121._8_4_;
                auVar91._12_4_ = auVar100._12_4_ + auVar121._12_4_;
                auVar91._16_4_ = auVar100._16_4_ + auVar121._16_4_;
                auVar91._20_4_ = auVar100._20_4_ + auVar121._20_4_;
                auVar91._24_4_ = auVar100._24_4_ + auVar121._24_4_;
                auVar91._28_4_ = fVar88 + auVar121._28_4_;
                auVar41._4_4_ = auVar24._4_4_ * auVar126._4_4_;
                auVar41._0_4_ = auVar24._0_4_ * auVar126._0_4_;
                auVar41._8_4_ = auVar24._8_4_ * auVar126._8_4_;
                auVar41._12_4_ = auVar24._12_4_ * auVar126._12_4_;
                auVar41._16_4_ = auVar24._16_4_ * auVar126._16_4_;
                auVar41._20_4_ = auVar24._20_4_ * auVar126._20_4_;
                auVar41._24_4_ = auVar24._24_4_ * auVar126._24_4_;
                auVar41._28_4_ = fVar88;
                auVar12 = vfmsub231ps_fma(auVar41,auVar25,auVar91);
                auVar42._4_4_ = auVar91._4_4_ * auVar129._4_4_;
                auVar42._0_4_ = auVar91._0_4_ * auVar129._0_4_;
                auVar42._8_4_ = auVar91._8_4_ * auVar129._8_4_;
                auVar42._12_4_ = auVar91._12_4_ * auVar129._12_4_;
                auVar42._16_4_ = auVar91._16_4_ * auVar129._16_4_;
                auVar42._20_4_ = auVar91._20_4_ * auVar129._20_4_;
                auVar42._24_4_ = auVar91._24_4_ * auVar129._24_4_;
                auVar42._28_4_ = auVar91._28_4_;
                auVar11 = vfmsub231ps_fma(auVar42,auVar24,auVar138);
                auVar43._4_4_ = auVar25._4_4_ * auVar138._4_4_;
                auVar43._0_4_ = auVar25._0_4_ * auVar138._0_4_;
                auVar43._8_4_ = auVar25._8_4_ * auVar138._8_4_;
                auVar43._12_4_ = auVar25._12_4_ * auVar138._12_4_;
                auVar43._16_4_ = auVar25._16_4_ * auVar138._16_4_;
                auVar43._20_4_ = auVar25._20_4_ * auVar138._20_4_;
                auVar43._24_4_ = auVar25._24_4_ * auVar138._24_4_;
                auVar43._28_4_ = auVar138._28_4_;
                auVar133 = vfmsub231ps_fma(auVar43,auVar129,auVar126);
                local_2940._0_4_ = local_2940._4_4_;
                fStack_2938 = (float)local_2940._4_4_;
                fStack_2934 = (float)local_2940._4_4_;
                fStack_2930 = (float)local_2940._4_4_;
                fStack_292c = (float)local_2940._4_4_;
                fStack_2928 = (float)local_2940._4_4_;
                fStack_2924 = (float)local_2940._4_4_;
                auVar139._0_4_ = (float)local_2940._4_4_ * auVar133._0_4_;
                auVar139._4_4_ = (float)local_2940._4_4_ * auVar133._4_4_;
                auVar139._8_4_ = (float)local_2940._4_4_ * auVar133._8_4_;
                auVar139._12_4_ = (float)local_2940._4_4_ * auVar133._12_4_;
                auVar139._16_4_ = (float)local_2940._4_4_ * 0.0;
                auVar139._20_4_ = (float)local_2940._4_4_ * 0.0;
                auVar139._24_4_ = (float)local_2940._4_4_ * 0.0;
                auVar139._28_4_ = 0;
                auVar11 = vfmadd231ps_fma(auVar139,local_2880,ZEXT1632(auVar11));
                auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_2920,ZEXT1632(auVar12));
                fVar88 = auVar11._0_4_ + auVar122._0_4_ + auVar135._0_4_;
                fVar94 = auVar11._4_4_ + auVar122._4_4_ + auVar135._4_4_;
                fVar95 = auVar11._8_4_ + auVar122._8_4_ + auVar135._8_4_;
                fVar96 = auVar11._12_4_ + auVar122._12_4_ + auVar135._12_4_;
                local_2860 = ZEXT1632(CONCAT412(fVar96,CONCAT48(fVar95,CONCAT44(fVar94,fVar88))));
                auVar127._8_4_ = 0x7fffffff;
                auVar127._0_8_ = 0x7fffffff7fffffff;
                auVar127._12_4_ = 0x7fffffff;
                auVar127._16_4_ = 0x7fffffff;
                auVar127._20_4_ = 0x7fffffff;
                auVar127._24_4_ = 0x7fffffff;
                auVar127._28_4_ = 0x7fffffff;
                auVar121 = ZEXT1632(auVar122);
                auVar128 = vminps_avx(auVar121,ZEXT1632(auVar135));
                auVar128 = vminps_avx(auVar128,ZEXT1632(auVar11));
                local_2520 = vandps_avx(local_2860,auVar127);
                local_2500._8_4_ = 0x80000000;
                local_2500._0_8_ = 0x8000000080000000;
                local_2500._12_4_ = 0x80000000;
                local_2500._16_4_ = 0x80000000;
                local_2500._20_4_ = 0x80000000;
                local_2500._24_4_ = 0x80000000;
                local_2500._28_4_ = 0x80000000;
                fVar158 = local_2520._0_4_ * 1.1920929e-07;
                fVar161 = local_2520._4_4_ * 1.1920929e-07;
                auVar44._4_4_ = fVar161;
                auVar44._0_4_ = fVar158;
                fVar162 = local_2520._8_4_ * 1.1920929e-07;
                auVar44._8_4_ = fVar162;
                fVar163 = local_2520._12_4_ * 1.1920929e-07;
                auVar44._12_4_ = fVar163;
                fVar164 = local_2520._16_4_ * 1.1920929e-07;
                auVar44._16_4_ = fVar164;
                fVar165 = local_2520._20_4_ * 1.1920929e-07;
                auVar44._20_4_ = fVar165;
                fVar166 = local_2520._24_4_ * 1.1920929e-07;
                auVar44._24_4_ = fVar166;
                auVar44._28_4_ = 0x34000000;
                auVar168._0_8_ = CONCAT44(fVar161,fVar158) ^ 0x8000000080000000;
                auVar168._8_4_ = -fVar162;
                auVar168._12_4_ = -fVar163;
                auVar168._16_4_ = -fVar164;
                auVar168._20_4_ = -fVar165;
                auVar168._24_4_ = -fVar166;
                auVar168._28_4_ = 0xb4000000;
                auVar128 = vcmpps_avx(auVar128,auVar168,5);
                auVar101 = ZEXT1632(auVar135);
                auVar13 = vmaxps_avx(auVar121,auVar101);
                auVar100 = vmaxps_avx(auVar13,ZEXT1632(auVar11));
                auVar100 = vcmpps_avx(auVar100,auVar44,2);
                local_24e0 = vorps_avx(auVar128,auVar100);
                auVar100 = local_27c0 & local_24e0;
                if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar100 >> 0x7f,0) != '\0') ||
                      (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar100 >> 0xbf,0) != '\0') ||
                    (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar100[0x1f] < '\0') {
                  auVar45._4_4_ = local_2460._4_4_ * fVar104;
                  auVar45._0_4_ = local_2460._0_4_ * fVar86;
                  auVar45._8_4_ = local_2460._8_4_ * fVar110;
                  auVar45._12_4_ = local_2460._12_4_ * fVar14;
                  auVar45._16_4_ = local_2460._16_4_ * fVar17;
                  auVar45._20_4_ = local_2460._20_4_ * fVar20;
                  auVar45._24_4_ = local_2460._24_4_ * fVar23;
                  auVar45._28_4_ = local_24e0._28_4_;
                  auVar46._4_4_ = local_2480._4_4_ * fVar97;
                  auVar46._0_4_ = local_2480._0_4_ * fVar85;
                  auVar46._8_4_ = local_2480._8_4_ * fVar108;
                  auVar46._12_4_ = local_2480._12_4_ * fVar113;
                  auVar46._16_4_ = local_2480._16_4_ * fVar16;
                  auVar46._20_4_ = local_2480._20_4_ * fVar19;
                  auVar46._24_4_ = local_2480._24_4_ * fVar22;
                  auVar46._28_4_ = auVar128._28_4_;
                  auVar122 = vfmsub213ps_fma(local_2480,local_24c0,auVar45);
                  auVar47._4_4_ = auVar25._4_4_ * fVar87;
                  auVar47._0_4_ = auVar25._0_4_ * fVar79;
                  auVar47._8_4_ = auVar25._8_4_ * fVar106;
                  auVar47._12_4_ = auVar25._12_4_ * fVar112;
                  auVar47._16_4_ = auVar25._16_4_ * fVar15;
                  auVar47._20_4_ = auVar25._20_4_ * fVar18;
                  auVar47._24_4_ = auVar25._24_4_ * fVar21;
                  auVar47._28_4_ = 0x34000000;
                  auVar48._4_4_ = fVar97 * auVar24._4_4_;
                  auVar48._0_4_ = fVar85 * auVar24._0_4_;
                  auVar48._8_4_ = fVar108 * auVar24._8_4_;
                  auVar48._12_4_ = fVar113 * auVar24._12_4_;
                  auVar48._16_4_ = fVar16 * auVar24._16_4_;
                  auVar48._20_4_ = fVar19 * auVar24._20_4_;
                  auVar48._24_4_ = fVar22 * auVar24._24_4_;
                  auVar48._28_4_ = auVar13._28_4_;
                  auVar135 = vfmsub213ps_fma(auVar24,local_24a0,auVar47);
                  auVar128 = vandps_avx(auVar45,auVar127);
                  auVar100 = vandps_avx(auVar47,auVar127);
                  auVar128 = vcmpps_avx(auVar128,auVar100,1);
                  auVar13 = vblendvps_avx(ZEXT1632(auVar135),ZEXT1632(auVar122),auVar128);
                  auVar49._4_4_ = fVar104 * auVar129._4_4_;
                  auVar49._0_4_ = fVar86 * auVar129._0_4_;
                  auVar49._8_4_ = fVar110 * auVar129._8_4_;
                  auVar49._12_4_ = fVar14 * auVar129._12_4_;
                  auVar49._16_4_ = fVar17 * auVar129._16_4_;
                  auVar49._20_4_ = fVar20 * auVar129._20_4_;
                  auVar49._24_4_ = fVar23 * auVar129._24_4_;
                  auVar49._28_4_ = auVar100._28_4_;
                  auVar122 = vfmsub213ps_fma(auVar129,local_24c0,auVar48);
                  auVar50._4_4_ = local_2440._4_4_ * fVar87;
                  auVar50._0_4_ = local_2440._0_4_ * fVar79;
                  auVar50._8_4_ = local_2440._8_4_ * fVar106;
                  auVar50._12_4_ = local_2440._12_4_ * fVar112;
                  auVar50._16_4_ = local_2440._16_4_ * fVar15;
                  auVar50._20_4_ = local_2440._20_4_ * fVar18;
                  auVar50._24_4_ = local_2440._24_4_ * fVar21;
                  auVar50._28_4_ = local_24c0._28_4_;
                  auVar135 = vfmsub213ps_fma(local_2460,auVar26,auVar50);
                  auVar128 = vandps_avx(auVar50,auVar127);
                  auVar100 = vandps_avx(auVar48,auVar127);
                  auVar128 = vcmpps_avx(auVar128,auVar100,1);
                  auVar24 = vblendvps_avx(ZEXT1632(auVar122),ZEXT1632(auVar135),auVar128);
                  auVar122 = vfmsub213ps_fma(local_2440,local_24a0,auVar46);
                  auVar135 = vfmsub213ps_fma(auVar25,auVar26,auVar49);
                  auVar128 = vandps_avx(auVar46,auVar127);
                  auVar100 = vandps_avx(auVar49,auVar127);
                  auVar128 = vcmpps_avx(auVar128,auVar100,1);
                  auVar26 = vblendvps_avx(ZEXT1632(auVar135),ZEXT1632(auVar122),auVar128);
                  fVar97 = auVar26._0_4_;
                  fVar104 = auVar26._4_4_;
                  auVar51._4_4_ = fVar104 * (float)local_2940._4_4_;
                  auVar51._0_4_ = fVar97 * (float)local_2940._4_4_;
                  fVar106 = auVar26._8_4_;
                  auVar51._8_4_ = fVar106 * (float)local_2940._4_4_;
                  fVar108 = auVar26._12_4_;
                  auVar51._12_4_ = fVar108 * (float)local_2940._4_4_;
                  fVar110 = auVar26._16_4_;
                  auVar51._16_4_ = fVar110 * (float)local_2940._4_4_;
                  fVar112 = auVar26._20_4_;
                  auVar51._20_4_ = fVar112 * (float)local_2940._4_4_;
                  fVar113 = auVar26._24_4_;
                  auVar51._24_4_ = fVar113 * (float)local_2940._4_4_;
                  auVar51._28_4_ = auVar128._28_4_;
                  auVar122 = vfmadd213ps_fma(local_2880,auVar24,auVar51);
                  auVar122 = vfmadd213ps_fma(local_2920,auVar13,ZEXT1632(auVar122));
                  fVar79 = auVar122._0_4_ + auVar122._0_4_;
                  fVar85 = auVar122._4_4_ + auVar122._4_4_;
                  fVar86 = auVar122._8_4_ + auVar122._8_4_;
                  fVar87 = auVar122._12_4_ + auVar122._12_4_;
                  auVar129 = ZEXT1632(CONCAT412(fVar87,CONCAT48(fVar86,CONCAT44(fVar85,fVar79))));
                  auVar52._4_4_ = fVar104 * fVar105;
                  auVar52._0_4_ = fVar97 * fVar98;
                  auVar52._8_4_ = fVar106 * fVar107;
                  auVar52._12_4_ = fVar108 * fVar109;
                  auVar52._16_4_ = fVar110 * fVar111;
                  auVar52._20_4_ = fVar112 * auVar123._0_4_;
                  auVar52._24_4_ = fVar113 * fVar115;
                  auVar52._28_4_ = auVar100._28_4_;
                  auVar122 = vfmadd213ps_fma(local_2400,auVar24,auVar52);
                  auVar135 = vfmadd213ps_fma(local_23e0,auVar13,ZEXT1632(auVar122));
                  auVar128 = vrcpps_avx(auVar129);
                  auVar169._8_4_ = 0x3f800000;
                  auVar169._0_8_ = 0x3f8000003f800000;
                  auVar169._12_4_ = 0x3f800000;
                  auVar169._16_4_ = 0x3f800000;
                  auVar169._20_4_ = 0x3f800000;
                  auVar169._24_4_ = 0x3f800000;
                  auVar169._28_4_ = 0x3f800000;
                  auVar122 = vfnmadd213ps_fma(auVar128,auVar129,auVar169);
                  auVar122 = vfmadd132ps_fma(ZEXT1632(auVar122),auVar128,auVar128);
                  uVar78 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
                  auVar155._4_4_ = uVar78;
                  auVar155._0_4_ = uVar78;
                  auVar155._8_4_ = uVar78;
                  auVar155._12_4_ = uVar78;
                  auVar155._16_4_ = uVar78;
                  auVar155._20_4_ = uVar78;
                  auVar155._24_4_ = uVar78;
                  auVar155._28_4_ = uVar78;
                  local_26c0 = ZEXT1632(CONCAT412(auVar122._12_4_ *
                                                  (auVar135._12_4_ + auVar135._12_4_),
                                                  CONCAT48(auVar122._8_4_ *
                                                           (auVar135._8_4_ + auVar135._8_4_),
                                                           CONCAT44(auVar122._4_4_ *
                                                                    (auVar135._4_4_ + auVar135._4_4_
                                                                    ),auVar122._0_4_ *
                                                                      (auVar135._0_4_ +
                                                                      auVar135._0_4_)))));
                  auVar132 = ZEXT3264(local_26c0);
                  auVar128 = vcmpps_avx(auVar155,local_26c0,2);
                  auVar156._4_4_ = fVar114;
                  auVar156._0_4_ = fVar114;
                  auVar156._8_4_ = fVar114;
                  auVar156._12_4_ = fVar114;
                  auVar156._16_4_ = fVar114;
                  auVar156._20_4_ = fVar114;
                  auVar156._24_4_ = fVar114;
                  auVar156._28_4_ = fVar114;
                  auVar100 = vcmpps_avx(local_26c0,auVar156,2);
                  auVar128 = vandps_avx(auVar100,auVar128);
                  auVar157._0_8_ = CONCAT44(fVar85,fVar79) ^ 0x8000000080000000;
                  auVar157._8_4_ = -fVar86;
                  auVar157._12_4_ = -fVar87;
                  auVar157._16_4_ = 0x80000000;
                  auVar157._20_4_ = 0x80000000;
                  auVar157._24_4_ = 0x80000000;
                  auVar157._28_4_ = 0x80000000;
                  auVar100 = vcmpps_avx(auVar157,auVar129,4);
                  auVar128 = vandps_avx(auVar100,auVar128);
                  auVar100 = vandps_avx(local_24e0,local_27c0);
                  auVar128 = vpslld_avx2(auVar128,0x1f);
                  auVar129 = vpsrad_avx2(auVar128,0x1f);
                  auVar128 = auVar100 & auVar129;
                  if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar128 >> 0x7f,0) != '\0') ||
                        (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar128 >> 0xbf,0) != '\0') ||
                      (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar128[0x1f] < '\0') {
                    auVar128 = vandps_avx(auVar129,auVar100);
                    uVar71 = vextractps_avx(SUB3216(*(undefined1 (*) [32])
                                                     ((long)&(ray->super_RayK<1>).org.field_0 + 0xc)
                                                    ,0x10),2);
                    local_2760 = local_2860;
                    local_2740 = &local_2a19;
                    local_2720 = auVar128;
                    auVar100 = vsubps_avx(local_2860,auVar101);
                    auVar100 = vblendvps_avx(auVar121,auVar100,local_2600);
                    auVar121 = vsubps_avx(local_2860,auVar121);
                    local_2780 = vblendvps_avx(auVar101,auVar121,local_2600);
                    local_26a0[0] = (float)local_2620._0_4_ * auVar13._0_4_;
                    local_26a0[1] = (float)local_2620._4_4_ * auVar13._4_4_;
                    local_26a0[2] = fStack_2618 * auVar13._8_4_;
                    local_26a0[3] = fStack_2614 * auVar13._12_4_;
                    fStack_2690 = fStack_2610 * auVar13._16_4_;
                    fStack_268c = fStack_260c * auVar13._20_4_;
                    fStack_2688 = fStack_2608 * auVar13._24_4_;
                    uStack_2684 = auVar13._28_4_;
                    local_2680[0] = (float)local_2620._0_4_ * auVar24._0_4_;
                    local_2680[1] = (float)local_2620._4_4_ * auVar24._4_4_;
                    local_2680[2] = fStack_2618 * auVar24._8_4_;
                    local_2680[3] = fStack_2614 * auVar24._12_4_;
                    fStack_2670 = fStack_2610 * auVar24._16_4_;
                    fStack_266c = fStack_260c * auVar24._20_4_;
                    fStack_2668 = fStack_2608 * auVar24._24_4_;
                    uStack_2664 = auVar13._28_4_;
                    local_2660[0] = (float)local_2620._0_4_ * fVar97;
                    local_2660[1] = (float)local_2620._4_4_ * fVar104;
                    local_2660[2] = fStack_2618 * fVar106;
                    local_2660[3] = fStack_2614 * fVar108;
                    fStack_2650 = fStack_2610 * fVar110;
                    fStack_264c = fStack_260c * fVar112;
                    fStack_2648 = fStack_2608 * fVar113;
                    uStack_2644 = auVar26._28_4_;
                    auVar103._0_8_ = (ulong)CONCAT24(uVar6,(uint)uVar6) & 0x7fff00007fff;
                    auVar103._8_4_ = uVar68;
                    auVar103._12_4_ = uVar68;
                    auVar103._16_4_ = uVar68;
                    auVar103._20_4_ = uVar68;
                    auVar103._24_4_ = uVar68;
                    auVar103._28_4_ = uVar68;
                    auVar135 = ZEXT416((uint)(float)(int)(*(ushort *)(lVar57 + 8 + lVar67) - 1));
                    auVar13 = vpaddd_avx2(auVar103,_DAT_01fec4a0);
                    auVar122 = vrcpss_avx(auVar135,auVar135);
                    auVar135 = vfnmadd213ss_fma(auVar122,auVar135,ZEXT416(0x40000000));
                    fVar114 = auVar122._0_4_ * auVar135._0_4_;
                    auVar13 = vcvtdq2ps_avx(auVar13);
                    fVar115 = auVar13._28_4_ + auVar100._28_4_;
                    fVar98 = (fVar88 * auVar13._0_4_ + auVar100._0_4_) * fVar114;
                    fVar105 = (fVar94 * auVar13._4_4_ + auVar100._4_4_) * fVar114;
                    local_27a0._4_4_ = fVar105;
                    local_27a0._0_4_ = fVar98;
                    fVar107 = (fVar95 * auVar13._8_4_ + auVar100._8_4_) * fVar114;
                    local_27a0._8_4_ = fVar107;
                    fVar109 = (fVar96 * auVar13._12_4_ + auVar100._12_4_) * fVar114;
                    local_27a0._12_4_ = fVar109;
                    fVar111 = (auVar13._16_4_ * 0.0 + auVar100._16_4_) * fVar114;
                    local_27a0._16_4_ = fVar111;
                    auVar123._0_4_ = (auVar13._20_4_ * 0.0 + auVar100._20_4_) * fVar114;
                    local_27a0._20_4_ = auVar123._0_4_;
                    fVar114 = (auVar13._24_4_ * 0.0 + auVar100._24_4_) * fVar114;
                    local_27a0._24_4_ = fVar114;
                    local_27a0._28_4_ = fVar115;
                    pGVar8 = (local_2980->geometries).items[local_29e8].ptr;
                    if ((pGVar8->mask & uVar71) != 0) {
                      auVar130._0_8_ = (ulong)CONCAT24(uVar7,(uint)uVar7) & 0x7fff00007fff;
                      auVar130._8_4_ = local_29e0;
                      auVar130._12_4_ = local_29e0;
                      auVar130._16_4_ = local_29e0;
                      auVar130._20_4_ = local_29e0;
                      auVar130._24_4_ = local_29e0;
                      auVar130._28_4_ = local_29e0;
                      auVar100 = vpaddd_avx2(auVar130,_DAT_01fec4c0);
                      auVar13 = vcvtdq2ps_avx(auVar100);
                      auVar135 = ZEXT416((uint)(float)(int)(*(ushort *)(lVar57 + 10 + lVar67) - 1));
                      auVar122 = vrcpss_avx(auVar135,auVar135);
                      auVar135 = vfnmadd213ss_fma(auVar122,auVar135,ZEXT416(0x40000000));
                      fVar79 = auVar122._0_4_ * auVar135._0_4_;
                      local_2840 = auVar128;
                      auVar100 = vrcpps_avx(local_2860);
                      auVar140._8_4_ = 0x3f800000;
                      auVar140._0_8_ = 0x3f8000003f800000;
                      auVar140._12_4_ = 0x3f800000;
                      auVar140._16_4_ = 0x3f800000;
                      auVar140._20_4_ = 0x3f800000;
                      auVar140._24_4_ = 0x3f800000;
                      auVar140._28_4_ = 0x3f800000;
                      auVar122 = vfnmadd213ps_fma(local_2860,auVar100,auVar140);
                      auVar122 = vfmadd132ps_fma(ZEXT1632(auVar122),auVar100,auVar100);
                      auVar131._8_4_ = 0x219392ef;
                      auVar131._0_8_ = 0x219392ef219392ef;
                      auVar131._12_4_ = 0x219392ef;
                      auVar131._16_4_ = 0x219392ef;
                      auVar131._20_4_ = 0x219392ef;
                      auVar131._24_4_ = 0x219392ef;
                      auVar131._28_4_ = 0x219392ef;
                      auVar100 = vcmpps_avx(local_2520,auVar131,5);
                      auVar100 = vandps_avx(auVar100,ZEXT1632(auVar122));
                      auVar53._4_4_ = fVar105 * auVar100._4_4_;
                      auVar53._0_4_ = fVar98 * auVar100._0_4_;
                      auVar53._8_4_ = fVar107 * auVar100._8_4_;
                      auVar53._12_4_ = fVar109 * auVar100._12_4_;
                      auVar53._16_4_ = fVar111 * auVar100._16_4_;
                      auVar53._20_4_ = auVar123._0_4_ * auVar100._20_4_;
                      auVar53._24_4_ = fVar114 * auVar100._24_4_;
                      auVar53._28_4_ = fVar115;
                      local_2700 = vminps_avx(auVar53,auVar140);
                      auVar54._4_4_ =
                           (fVar94 * auVar13._4_4_ + local_2780._4_4_) * fVar79 * auVar100._4_4_;
                      auVar54._0_4_ =
                           (fVar88 * auVar13._0_4_ + local_2780._0_4_) * fVar79 * auVar100._0_4_;
                      auVar54._8_4_ =
                           (fVar95 * auVar13._8_4_ + local_2780._8_4_) * fVar79 * auVar100._8_4_;
                      auVar54._12_4_ =
                           (fVar96 * auVar13._12_4_ + local_2780._12_4_) * fVar79 * auVar100._12_4_;
                      auVar54._16_4_ =
                           (auVar13._16_4_ * 0.0 + local_2780._16_4_) * fVar79 * auVar100._16_4_;
                      auVar54._20_4_ =
                           (auVar13._20_4_ * 0.0 + local_2780._20_4_) * fVar79 * auVar100._20_4_;
                      auVar54._24_4_ =
                           (auVar13._24_4_ * 0.0 + local_2780._24_4_) * fVar79 * auVar100._24_4_;
                      auVar54._28_4_ = auVar100._28_4_;
                      local_26e0 = vminps_avx(auVar54,auVar140);
                      auVar92._8_4_ = 0x7f800000;
                      auVar92._0_8_ = 0x7f8000007f800000;
                      auVar92._12_4_ = 0x7f800000;
                      auVar92._16_4_ = 0x7f800000;
                      auVar92._20_4_ = 0x7f800000;
                      auVar92._24_4_ = 0x7f800000;
                      auVar92._28_4_ = 0x7f800000;
                      auVar100 = vblendvps_avx(auVar92,local_26c0,auVar128);
                      auVar13 = vshufps_avx(auVar100,auVar100,0xb1);
                      auVar13 = vminps_avx(auVar100,auVar13);
                      auVar24 = vshufpd_avx(auVar13,auVar13,5);
                      auVar13 = vminps_avx(auVar13,auVar24);
                      auVar24 = vpermpd_avx2(auVar13,0x4e);
                      auVar13 = vminps_avx(auVar13,auVar24);
                      auVar100 = vcmpps_avx(auVar100,auVar13,0);
                      auVar13 = auVar128 & auVar100;
                      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar13 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar13 >> 0x7f,0) != '\0') ||
                            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar13 >> 0xbf,0) != '\0') ||
                          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar13[0x1f] < '\0') {
                        auVar128 = vandps_avx(auVar100,auVar128);
                      }
                      uVar68 = vmovmskps_avx(auVar128);
                      uVar71 = 0;
                      for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
                        uVar71 = uVar71 + 1;
                      }
                      uVar63 = (ulong)uVar71;
                      local_2880._0_8_ = local_2a18->args;
                      if ((local_2a18->args->filter != (RTCFilterFunctionN)0x0) ||
                         (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                        local_2920 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                        pRVar10 = local_2a18->user;
                        _local_2940 = local_26c0;
                        do {
                          local_28e4 = *(undefined4 *)(local_2700 + uVar63 * 4);
                          local_28e0 = *(undefined4 *)(local_26e0 + uVar63 * 4);
                          (ray->super_RayK<1>).tfar = local_26a0[uVar63 - 8];
                          local_28f0 = local_26a0[uVar63];
                          local_28ec = local_2680[uVar63];
                          local_28e8 = local_2660[uVar63];
                          local_28dc = (int)local_29d8;
                          local_28d8 = (int)local_29e8;
                          local_28d4 = pRVar10->instID[0];
                          local_28d0 = pRVar10->instPrimID[0];
                          local_29dc = -1;
                          local_2970.valid = &local_29dc;
                          local_2970.geometryUserPtr = pGVar8->userPtr;
                          local_2970.context = pRVar10;
                          local_2970.ray = (RTCRayN *)ray;
                          local_2970.hit = (RTCHitN *)&local_28f0;
                          local_2970.N = 1;
                          if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_019bd768:
                            if ((*(code **)(local_2880._0_8_ + 0x10) != (code *)0x0) &&
                               (((*(byte *)local_2880._0_8_ & 2) != 0 ||
                                (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                              (**(code **)(local_2880._0_8_ + 0x10))(&local_2970);
                              auVar132 = ZEXT3264(_local_2940);
                              if (*local_2970.valid == 0) goto LAB_019bd80b;
                            }
                            (((Vec3f *)((long)local_2970.ray + 0x30))->field_0).field_0.x =
                                 *(float *)local_2970.hit;
                            (((Vec3f *)((long)local_2970.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_2970.hit + 4);
                            (((Vec3f *)((long)local_2970.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_2970.hit + 8);
                            *(float *)((long)local_2970.ray + 0x3c) =
                                 *(float *)(local_2970.hit + 0xc);
                            *(float *)((long)local_2970.ray + 0x40) =
                                 *(float *)(local_2970.hit + 0x10);
                            *(float *)((long)local_2970.ray + 0x44) =
                                 *(float *)(local_2970.hit + 0x14);
                            *(float *)((long)local_2970.ray + 0x48) =
                                 *(float *)(local_2970.hit + 0x18);
                            *(float *)((long)local_2970.ray + 0x4c) =
                                 *(float *)(local_2970.hit + 0x1c);
                            *(float *)((long)local_2970.ray + 0x50) =
                                 *(float *)(local_2970.hit + 0x20);
                          }
                          else {
                            (*pGVar8->intersectionFilterN)(&local_2970);
                            auVar132 = ZEXT3264(_local_2940);
                            if (*local_2970.valid != 0) goto LAB_019bd768;
LAB_019bd80b:
                            (ray->super_RayK<1>).tfar = (float)local_2920._0_4_;
                          }
                          *(undefined4 *)(local_2840 + uVar63 * 4) = 0;
                          auVar13 = local_2840;
                          fVar114 = (ray->super_RayK<1>).tfar;
                          auVar84._4_4_ = fVar114;
                          auVar84._0_4_ = fVar114;
                          auVar84._8_4_ = fVar114;
                          auVar84._12_4_ = fVar114;
                          auVar84._16_4_ = fVar114;
                          auVar84._20_4_ = fVar114;
                          auVar84._24_4_ = fVar114;
                          auVar84._28_4_ = fVar114;
                          auVar100 = vcmpps_avx(auVar132._0_32_,auVar84,2);
                          auVar128 = vandps_avx(auVar100,local_2840);
                          local_2840 = auVar128;
                          auVar13 = auVar13 & auVar100;
                          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar13 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar13 >> 0x7f,0) == '\0') &&
                                (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar13 >> 0xbf,0) == '\0') &&
                              (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar13[0x1f]) goto LAB_019bd5c9;
                          auVar93._8_4_ = 0x7f800000;
                          auVar93._0_8_ = 0x7f8000007f800000;
                          auVar93._12_4_ = 0x7f800000;
                          auVar93._16_4_ = 0x7f800000;
                          auVar93._20_4_ = 0x7f800000;
                          auVar93._24_4_ = 0x7f800000;
                          auVar93._28_4_ = 0x7f800000;
                          auVar100 = vblendvps_avx(auVar93,auVar132._0_32_,auVar128);
                          auVar13 = vshufps_avx(auVar100,auVar100,0xb1);
                          auVar13 = vminps_avx(auVar100,auVar13);
                          auVar24 = vshufpd_avx(auVar13,auVar13,5);
                          auVar13 = vminps_avx(auVar13,auVar24);
                          auVar24 = vpermpd_avx2(auVar13,0x4e);
                          auVar13 = vminps_avx(auVar13,auVar24);
                          auVar100 = vcmpps_avx(auVar100,auVar13,0);
                          auVar13 = auVar128 & auVar100;
                          local_2920 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar13 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar13 >> 0x7f,0) != '\0') ||
                                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar13 >> 0xbf,0) != '\0') ||
                              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar13[0x1f] < '\0') {
                            auVar128 = vandps_avx(auVar100,auVar128);
                          }
                          uVar55 = vmovmskps_avx(auVar128);
                          uVar64 = 0;
                          for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x80000000) {
                            uVar64 = uVar64 + 1;
                          }
                          uVar63 = (ulong)uVar64;
                        } while( true );
                      }
                      fVar114 = *(float *)(local_2700 + uVar63 * 4);
                      fVar98 = *(float *)(local_26e0 + uVar63 * 4);
                      fVar105 = local_26a0[uVar63];
                      fVar107 = local_2680[uVar63];
                      fVar109 = local_2660[uVar63];
                      (ray->super_RayK<1>).tfar = local_26a0[uVar63 - 8];
                      (ray->Ng).field_0.field_0.x = fVar105;
                      (ray->Ng).field_0.field_0.y = fVar107;
                      (ray->Ng).field_0.field_0.z = fVar109;
                      ray->u = fVar114;
                      ray->v = fVar98;
                      ray->primID = uVar55;
                      ray->geomID = uVar64;
                      pRVar10 = local_2a18->user;
                      ray->instID[0] = pRVar10->instID[0];
                      ray->instPrimID[0] = pRVar10->instPrimID[0];
                    }
                  }
                }
LAB_019bd5c9:
                auVar160 = ZEXT3264(local_2560);
                auVar173 = ZEXT3264(local_2580);
                auVar176 = ZEXT3264(local_25a0);
                auVar175 = ZEXT3264(local_25c0);
                auVar171 = ZEXT3264(local_25e0);
                auVar178 = ZEXT3264(local_2540);
                context = local_2a18;
                uVar63 = local_2a00;
                pauVar56 = local_2990;
                uVar60 = local_29f0;
                uVar73 = local_29f8;
                uVar75 = local_2a10;
                uVar77 = local_2a08;
              }
              local_2978 = local_2978 - 1 & local_2978;
            } while (local_2978 != 0);
          }
          local_2998 = local_2998 + 1;
          fVar114 = local_2640;
          fVar98 = fStack_263c;
          fVar105 = fStack_2638;
          fVar107 = fStack_2634;
          fVar109 = fStack_2630;
          fVar111 = fStack_262c;
          auVar123._0_4_ = fStack_2628;
        } while (local_2998 != local_29a0);
      }
      fVar115 = (ray->super_RayK<1>).tfar;
      auVar178 = ZEXT3264(CONCAT428(fVar115,CONCAT424(fVar115,CONCAT420(fVar115,CONCAT416(fVar115,
                                                  CONCAT412(fVar115,CONCAT48(fVar115,CONCAT44(
                                                  fVar115,fVar115))))))));
      auVar141 = ZEXT3264(local_28a0);
      auVar146 = ZEXT3264(local_28c0);
      auVar152 = ZEXT3264(_local_27e0);
      auVar132 = ZEXT3264(_local_2800);
    }
    if (pauVar56 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }